

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::assign(WorkData *this,uint32_t varId,uint32_t regId)

{
  bool bVar1;
  uint in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  
  bVar1 = isAssigned((WorkData *)CONCAT44(in_ESI,in_EDX),(uint32_t)((ulong)in_RDI >> 0x20));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  if (*(char *)(in_RDI + 0x20 + (ulong)in_EDX) != -1) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  *(char *)(in_RDI + 0x20 + (ulong)in_EDX) = (char)in_ESI;
  *(uint *)(in_RDI + 0xc) = 1 << ((byte)in_EDX & 0x1f) ^ *(uint *)(in_RDI + 0xc);
  return;
}

Assistant:

inline void assign(uint32_t varId, uint32_t regId) noexcept {
      ASMJIT_ASSERT(!isAssigned(regId));
      ASMJIT_ASSERT(_physToVarId[regId] == kVarIdNone);

      _physToVarId[regId] = uint8_t(varId);
      _assignedRegs ^= Support::bitMask(regId);
    }